

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

void Emb_ManVecNormal(float *pVec,int nDims)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)nDims;
  if (nDims < 1) {
    uVar2 = uVar1;
  }
  dVar3 = 0.0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    dVar3 = dVar3 + (double)(pVec[uVar1] * pVec[uVar1]);
  }
  dVar3 = pow(dVar3,0.5);
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    pVec[uVar1] = (float)((double)pVec[uVar1] / dVar3);
  }
  return;
}

Assistant:

void Emb_ManVecNormal( float * pVec, int nDims )
{
    int i;
    double Norm = 0.0;
    for ( i = 0; i < nDims; i++ )
        Norm += pVec[i] * pVec[i];
    Norm = pow( Norm, 0.5 );
    for ( i = 0; i < nDims; i++ )
        pVec[i] /= Norm;
}